

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

void CESkyCoord::Galactic2CIRS(CESkyCoord *in_galactic,CESkyCoord *out_cirs,CEDate *date)

{
  CESkyCoord tmp_icrs;
  CESkyCoord *in_stack_000000b8;
  CESkyCoord *in_stack_000000c0;
  CEDate *in_stack_000000d0;
  CESkyCoord *in_stack_000000d8;
  CESkyCoord *in_stack_000000e0;
  CESkyCoord *this;
  CESkyCoord *in_stack_ffffffffffffffc0;
  
  this = (CESkyCoord *)&stack0xffffffffffffffb8;
  CESkyCoord(in_stack_ffffffffffffffc0);
  Galactic2ICRS(in_stack_000000c0,in_stack_000000b8);
  ICRS2CIRS(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
  ~CESkyCoord(this);
  return;
}

Assistant:

void CESkyCoord::Galactic2CIRS(const CESkyCoord& in_galactic,
                               CESkyCoord*       out_cirs,
                               const CEDate&     date)
{
    // Do the Galactic -> ICRS converstion
    CESkyCoord tmp_icrs;
    Galactic2ICRS(in_galactic, &tmp_icrs);
    
    // Now convert ICRS -> CIRS
    ICRS2CIRS(tmp_icrs, out_cirs, date);
    
    return;
}